

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Part::RS_Part
          (RS_Part *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  undefined8 uVar1;
  element_type *peVar2;
  ChBodyAuxRef *__p;
  undefined1 auVar3 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_0019f9b8;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  auVar3._8_4_ = 0x3f800000;
  auVar3._0_8_ = 0x3f8000003f800000;
  auVar3._12_4_ = 0x3f800000;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  (this->m_offset).m_data[2] = 0.0;
  *(undefined1 (*) [16])(this->m_offset).m_data = ZEXT416(0) << 0x40;
  uVar1 = vmovlps_avx(auVar3);
  (this->m_color).R = (float)(int)uVar1;
  (this->m_color).G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_color).B = 1.0;
  __p = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            ((__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2> *)&local_50,__p);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::operator+(&local_50,name,"_body");
  std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

RS_Part::RS_Part(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : m_name(name), m_mat(mat) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
}